

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoCaps.cpp
# Opt level: O3

void __thiscall TwoCaps::TwoCaps(TwoCaps *this,double radius)

{
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00107d50;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Parameterization).name,0,
             (char *)(this->super_Parameterization).name._M_string_length,0x106340);
  *(undefined4 *)&this->theta1_lb = 0;
  *(undefined4 *)((long)&this->theta1_lb + 4) = 0;
  *(undefined4 *)&this->theta1_ub = 0x54442d18;
  *(undefined4 *)((long)&this->theta1_ub + 4) = 0x401921fb;
  this->theta2_lb = 0.6283185307179586;
  this->theta2_ub = 2.5132741228718345;
  (this->super_Parameterization).Jmax = 0xa0;
  (this->super_Parameterization).Kmax = 0x30;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 3;
  this->d_theta1 = 0.039516888724399915;
  this->d_theta2 = 0.04010543813093353;
  this->theta1_cap_lb = -0.7085294069798257;
  this->theta1_cap_ub = 0.7085294069798257;
  this->theta2_cap_lb = 0.8622669198150709;
  this->theta2_cap_ub = 2.2793257337747224;
  this->d_theta1_cap = 0.040487394684561466;
  this->d_theta2_cap = 0.04048739468456147;
  (this->super_Parameterization).x_lb = -0.1 - radius;
  (this->super_Parameterization).x_ub = radius + 0.1;
  (this->super_Parameterization).y_lb = -0.1 - radius;
  (this->super_Parameterization).y_ub = radius + 0.1;
  (this->super_Parameterization).z_lb = -radius;
  dVar1 = (radius + radius) * radius * 0.0007806906464281615;
  (this->super_Parameterization).z_ub = radius;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  auVar3._0_8_ = (this->super_Parameterization).x_ub - (this->super_Parameterization).x_lb;
  auVar3._8_8_ = (this->super_Parameterization).y_ub - (this->super_Parameterization).y_lb;
  iVar2 = (int)(auVar3._0_8_ / dVar1) + 1;
  this->Jmax_cap = iVar2;
  this->Kmax_cap = iVar2;
  dVar1 = (double)(int)(auVar3._0_8_ / dVar1);
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4 = divpd(auVar3,auVar4);
  (this->super_Parameterization).dx = (double)auVar4._0_8_;
  (this->super_Parameterization).dy = (double)auVar4._8_8_;
  (this->super_Parameterization).dz =
       ((this->super_Parameterization).z_ub - (this->super_Parameterization).z_lb) / dVar1;
  return;
}

Assistant:

TwoCaps::TwoCaps(double radius) : Parameterization(radius) {
  name = "TwoCaps";

  Jmax = 160;
  //Kmax = 36;
  Lmax = 1;
  Gmax = 3;

  // Angle in the xy-plane
  theta1_lb = 0.0e0;
  theta1_ub = 2.0e0 * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1.0e0);

  // Angle between positive z-axis and radius.
  theta2_lb = (1.0e0 / 5.0e0) * PI;
  theta2_ub = (4.0e0 / 5.0e0) * PI;

  Kmax = (int)((theta2_ub - theta2_lb) / d_theta1) + 1;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1.0e0);

  //-------------------------------------------
  // FOR THE CAPS
  double cap_overlap = 2.0e0 * d_theta2;      // (1.0e0 / 15.0e0) * PI;

  // Angle in the xy-plane
  theta1_cap_lb = -theta2_lb - cap_overlap;
  theta1_cap_ub =  theta2_lb + cap_overlap;

  Jmax_cap = (int)((theta1_cap_ub - theta1_cap_lb) / d_theta1) + 1;

  d_theta1_cap = (theta1_cap_ub - theta1_cap_lb) / (double)(Jmax_cap - 1);

  // Angle between positive z-axis and radius.
  theta2_cap_lb =  PI / 2.0e0 - theta2_lb - cap_overlap;
  theta2_cap_ub =  PI / 2.0e0 + theta2_lb + cap_overlap;

  Kmax_cap = (int)((theta1_cap_ub - theta1_cap_lb) / d_theta1) + 1;

  d_theta2_cap = (theta2_cap_ub - theta2_cap_lb) / (double)(Kmax_cap - 1);

  //-----------------------------------------------------
  x_lb = -radius - 0.1e0;
  x_ub =  radius + 0.1e0;

  y_lb = -radius - 0.1e0;
  y_ub =  radius + 0.1e0;

  z_lb = -radius;   // + 0.01e0;
  z_ub =  radius;   // - 0.01e0;

  double dx_tmp = sqrt(2.0e0 * radius * radius * (1.0e0 - cos(d_theta1)));

  Kmax_cap = Jmax_cap = (int)((x_ub - x_lb) / dx_tmp) + 1;

  dx = (x_ub - x_lb) / (double)(Jmax_cap - 1);
  dy = (y_ub - y_lb) / (double)(Jmax_cap - 1);
  dz = (z_ub - z_lb) / (double)(Jmax_cap - 1);
}